

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_morph.cpp
# Opt level: O1

void __thiscall AMorphProjectile::Serialize(AMorphProjectile *this,FSerializer *arc)

{
  BYTE *pBVar1;
  int iVar2;
  undefined4 extraout_var;
  FSerializer *pFVar3;
  PClassActor **ppPVar4;
  PClassActor **ppPVar5;
  
  AActor::Serialize(&this->super_AActor,arc);
  if ((this->super_AActor).super_DThinker.super_DObject.Class == (PClass *)0x0) {
    iVar2 = (**(this->super_AActor).super_DThinker.super_DObject._vptr_DObject)(this);
    (this->super_AActor).super_DThinker.super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar2)
    ;
  }
  pBVar1 = ((this->super_AActor).super_DThinker.super_DObject.Class)->Defaults;
  ppPVar5 = (PClassActor **)0x0;
  ppPVar4 = (PClassActor **)(pBVar1 + 0x4c0);
  if (save_full != false) {
    ppPVar4 = ppPVar5;
  }
  pFVar3 = Serialize<PClassActor>(arc,"playerclass",(PClassActor **)&this->PlayerClass,ppPVar4);
  ppPVar4 = (PClassActor **)(pBVar1 + 0x4c8);
  if (save_full != false) {
    ppPVar4 = ppPVar5;
  }
  pFVar3 = Serialize<PClassActor>(pFVar3,"monsterclass",&this->MonsterClass,ppPVar4);
  ppPVar4 = (PClassActor **)(pBVar1 + 0x4e0);
  if (save_full != false) {
    ppPVar4 = ppPVar5;
  }
  pFVar3 = ::Serialize(pFVar3,"duration",&this->Duration,(int32_t *)ppPVar4);
  ppPVar4 = (PClassActor **)(pBVar1 + 0x4e4);
  if (save_full != false) {
    ppPVar4 = ppPVar5;
  }
  pFVar3 = ::Serialize(pFVar3,"morphstyle",&this->MorphStyle,(int32_t *)ppPVar4);
  ppPVar4 = (PClassActor **)(pBVar1 + 0x4d0);
  if (save_full != false) {
    ppPVar4 = ppPVar5;
  }
  pFVar3 = Serialize<PClassActor>(pFVar3,"morphflash",&this->MorphFlash,ppPVar4);
  ppPVar4 = (PClassActor **)(pBVar1 + 0x4d8);
  if (save_full != false) {
    ppPVar4 = ppPVar5;
  }
  Serialize<PClassActor>(pFVar3,"unmorphflash",&this->UnMorphFlash,ppPVar4);
  return;
}

Assistant:

void AMorphProjectile::Serialize(FSerializer &arc)
{
	Super::Serialize (arc);
	auto def = (AMorphProjectile*)GetDefault();
	arc("playerclass", PlayerClass, def->PlayerClass)
		("monsterclass", MonsterClass, def->MonsterClass)
		("duration", Duration, def->Duration)
		("morphstyle", MorphStyle, def->MorphStyle)
		("morphflash", MorphFlash, def->MorphFlash)
		("unmorphflash", UnMorphFlash, def->UnMorphFlash);
}